

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O2

void ImGui::TableSaveSettings(ImGuiTable *table)

{
  uint uVar1;
  ImGuiContext *pIVar2;
  ImGuiTableSettings *pIVar3;
  bool bVar4;
  ImGuiTableColumn *pIVar5;
  ImGuiTableSettings *pIVar6;
  int iVar7;
  byte bVar8;
  int iVar9;
  byte bVar10;
  float fVar11;
  
  table->IsSettingsDirty = false;
  pIVar2 = GImGui;
  if ((table->Flags & 0x10) == 0) {
    pIVar3 = TableGetBoundSettings(table);
    if (pIVar3 == (ImGuiTableSettings *)0x0) {
      pIVar3 = TableSettingsCreate(table->ID,table->ColumnsCount);
      table->SettingsOffset = (int)pIVar3 - *(int *)&(pIVar2->SettingsTables).Buf.Data;
    }
    iVar9 = table->ColumnsCount;
    pIVar3->ColumnsCount = (ImGuiTableColumnIdx)iVar9;
    pIVar5 = (table->Columns).Data;
    pIVar3->SaveFlags = 0;
    pIVar6 = pIVar3 + 1;
    bVar4 = false;
    for (iVar7 = 0; iVar7 < iVar9; iVar7 = iVar7 + 1) {
      fVar11 = *(float *)((long)&pIVar5->WidthRequest + (ulong)(pIVar5->Flags & 8));
      pIVar6->ID = (ImGuiID)fVar11;
      *(char *)&pIVar6->RefScale = (char)iVar7;
      *(ImGuiTableColumnIdx *)((long)&pIVar6->RefScale + 1) = pIVar5->DisplayOrder;
      *(ImGuiTableColumnIdx *)((long)&pIVar6->RefScale + 2) = pIVar5->SortOrder;
      bVar8 = pIVar5->field_0x65 & 3;
      bVar10 = *(byte *)((long)&pIVar6->RefScale + 3);
      *(byte *)((long)&pIVar6->RefScale + 3) = bVar10 & 0xfc | bVar8;
      bVar10 = bVar10 & 0xf8 | bVar8 | pIVar5->IsUserEnabled << 2;
      *(byte *)((long)&pIVar6->RefScale + 3) = bVar10;
      *(byte *)((long)&pIVar6->RefScale + 3) = bVar10 & 0xf7 | (byte)pIVar5->Flags & 8;
      uVar1 = pIVar5->Flags;
      if ((fVar11 != pIVar5->InitStretchWeightOrWidth) ||
         (NAN(fVar11) || NAN(pIVar5->InitStretchWeightOrWidth))) {
        *(byte *)&pIVar3->SaveFlags = (byte)pIVar3->SaveFlags | 1;
      }
      if (iVar7 != pIVar5->DisplayOrder) {
        *(byte *)&pIVar3->SaveFlags = (byte)pIVar3->SaveFlags | 2;
      }
      if (pIVar5->SortOrder != -1) {
        *(byte *)&pIVar3->SaveFlags = (byte)pIVar3->SaveFlags | 8;
      }
      if ((uVar1 >> 1 & 1) == (uint)pIVar5->IsUserEnabled) {
        *(byte *)&pIVar3->SaveFlags = (byte)pIVar3->SaveFlags | 4;
      }
      bVar4 = (bool)(bVar4 | (uVar1 & 8) == 0);
      pIVar5 = pIVar5 + 1;
      pIVar6 = (ImGuiTableSettings *)&pIVar6->ColumnsCount;
      iVar9 = table->ColumnsCount;
    }
    pIVar3->SaveFlags = pIVar3->SaveFlags & table->Flags;
    fVar11 = 0.0;
    if (bVar4) {
      fVar11 = table->RefScale;
    }
    pIVar3->RefScale = fVar11;
    MarkIniSettingsDirty();
    return;
  }
  return;
}

Assistant:

void ImGui::TableSaveSettings(ImGuiTable* table)
{
    table->IsSettingsDirty = false;
    if (table->Flags & ImGuiTableFlags_NoSavedSettings)
        return;

    // Bind or create settings data
    ImGuiContext& g = *GImGui;
    ImGuiTableSettings* settings = TableGetBoundSettings(table);
    if (settings == NULL)
    {
        settings = TableSettingsCreate(table->ID, table->ColumnsCount);
        table->SettingsOffset = g.SettingsTables.offset_from_ptr(settings);
    }
    settings->ColumnsCount = (ImGuiTableColumnIdx)table->ColumnsCount;

    // Serialize ImGuiTable/ImGuiTableColumn into ImGuiTableSettings/ImGuiTableColumnSettings
    IM_ASSERT(settings->ID == table->ID);
    IM_ASSERT(settings->ColumnsCount == table->ColumnsCount && settings->ColumnsCountMax >= settings->ColumnsCount);
    ImGuiTableColumn* column = table->Columns.Data;
    ImGuiTableColumnSettings* column_settings = settings->GetColumnSettings();

    bool save_ref_scale = false;
    settings->SaveFlags = ImGuiTableFlags_None;
    for (int n = 0; n < table->ColumnsCount; n++, column++, column_settings++)
    {
        const float width_or_weight = (column->Flags & ImGuiTableColumnFlags_WidthStretch) ? column->StretchWeight : column->WidthRequest;
        column_settings->WidthOrWeight = width_or_weight;
        column_settings->Index = (ImGuiTableColumnIdx)n;
        column_settings->DisplayOrder = column->DisplayOrder;
        column_settings->SortOrder = column->SortOrder;
        column_settings->SortDirection = column->SortDirection;
        column_settings->IsEnabled = column->IsUserEnabled;
        column_settings->IsStretch = (column->Flags & ImGuiTableColumnFlags_WidthStretch) ? 1 : 0;
        if ((column->Flags & ImGuiTableColumnFlags_WidthStretch) == 0)
            save_ref_scale = true;

        // We skip saving some data in the .ini file when they are unnecessary to restore our state.
        // Note that fixed width where initial width was derived from auto-fit will always be saved as InitStretchWeightOrWidth will be 0.0f.
        // FIXME-TABLE: We don't have logic to easily compare SortOrder to DefaultSortOrder yet so it's always saved when present.
        if (width_or_weight != column->InitStretchWeightOrWidth)
            settings->SaveFlags |= ImGuiTableFlags_Resizable;
        if (column->DisplayOrder != n)
            settings->SaveFlags |= ImGuiTableFlags_Reorderable;
        if (column->SortOrder != -1)
            settings->SaveFlags |= ImGuiTableFlags_Sortable;
        if (column->IsUserEnabled != ((column->Flags & ImGuiTableColumnFlags_DefaultHide) == 0))
            settings->SaveFlags |= ImGuiTableFlags_Hideable;
    }
    settings->SaveFlags &= table->Flags;
    settings->RefScale = save_ref_scale ? table->RefScale : 0.0f;

    MarkIniSettingsDirty();
}